

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refresh.c
# Opt level: O0

void re_putc(EditLine *el,wint_t c,wchar_t shift)

{
  wchar_t wVar1;
  bool bVar2;
  el_refresh_t *peVar3;
  wchar_t local_28;
  wchar_t sizeh;
  wchar_t w;
  wchar_t i;
  coord_t *cur;
  wchar_t shift_local;
  wint_t c_local;
  EditLine *el_local;
  
  peVar3 = &el->el_refresh;
  local_28 = wcwidth(c);
  wVar1 = (el->el_terminal).t_size.h;
  if (local_28 == L'\xffffffff') {
    local_28 = L'\0';
  }
  while( true ) {
    bVar2 = false;
    if (shift != L'\0') {
      bVar2 = wVar1 < (peVar3->r_cursor).h + local_28;
    }
    if (!bVar2) break;
    re_putc(el,0x20,L'\x01');
  }
  el->el_vdisplay[(el->el_refresh).r_cursor.v][(peVar3->r_cursor).h] = c;
  sizeh = local_28;
  while (sizeh = sizeh + L'\xffffffff', L'\0' < sizeh) {
    el->el_vdisplay[(el->el_refresh).r_cursor.v][(peVar3->r_cursor).h + sizeh] = 0xffffffff;
  }
  if ((shift != L'\0') &&
     ((peVar3->r_cursor).h = local_28 + (peVar3->r_cursor).h, wVar1 <= (peVar3->r_cursor).h)) {
    el->el_vdisplay[(el->el_refresh).r_cursor.v][wVar1] = 0;
    re_nextline(el);
  }
  return;
}

Assistant:

libedit_private void
re_putc(EditLine *el, wint_t c, int shift)
{
	coord_t *cur = &el->el_refresh.r_cursor;
	int i, w = wcwidth(c);
	int sizeh = el->el_terminal.t_size.h;

	ELRE_DEBUG(1, (__F, "printing %5x '%lc'\r\n", c, c));
	if (w == -1)
		w = 0;

	while (shift && (cur->h + w > sizeh))
	    re_putc(el, ' ', 1);

	el->el_vdisplay[cur->v][cur->h] = c;
	/* assumes !shift is only used for single-column chars */
	i = w;
	while (--i > 0)
		el->el_vdisplay[cur->v][cur->h + i] = MB_FILL_CHAR;

	if (!shift)
		return;

	cur->h += w;	/* advance to next place */
	if (cur->h >= sizeh) {
		/* assure end of line */
		el->el_vdisplay[cur->v][sizeh] = '\0';
		re_nextline(el);
	}
}